

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayColorDepthAttachments.cpp
# Opt level: O1

bool __thiscall
glcts::TextureCubeMapArrayColorDepthAttachmentsTest::verifyDepth16Data
          (TextureCubeMapArrayColorDepthAttachmentsTest *this,_texture_size *texture_size,
          GLuint n_layer)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  unsigned_short *image;
  GLushort expected_value;
  unsigned_short local_32;
  long lVar3;
  
  local_32 = (unsigned_short)n_layer;
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  image = (unsigned_short *)operator_new__((ulong)(texture_size->m_size * texture_size->m_size) * 2)
  ;
  (**(code **)(lVar3 + 0xff0))(0xd05,2);
  (**(code **)(lVar3 + 0x1220))
            (0,0,texture_size->m_size,texture_size->m_size,0x1902,this->m_depth_type,image);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"glReadPixels() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayColorDepthAttachments.cpp"
                  ,0x441);
  bVar1 = verifyImage<unsigned_short,1u>(texture_size->m_size,texture_size->m_size,&local_32,image);
  operator_delete__(image);
  (**(code **)(lVar3 + 0xff0))(0xd05,4);
  return bVar1;
}

Assistant:

bool TextureCubeMapArrayColorDepthAttachmentsTest::verifyDepth16Data(const _texture_size& texture_size,
																	 glw::GLuint		  n_layer)
{
	/* Allocate buffer for the data we will retrieve from the implementation */
	glw::GLushort		  expected_value   = (glw::GLushort)n_layer;
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	bool				  result		   = false;
	const glw::GLuint	 result_data_size = texture_size.m_size * texture_size.m_size;
	glw::GLushort*		  result_data	  = new glw::GLushort[result_data_size];

	DE_ASSERT(result_data != NULL);

	gl.pixelStorei(GL_PACK_ALIGNMENT, 2);

	/* Read the data */
	gl.readPixels(0, /* x */
				  0, /* y */
				  texture_size.m_size, texture_size.m_size, m_depth_format, m_depth_type, result_data);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed");

	/* Verify image, expected value is layer index */
	result = verifyImage<glw::GLushort, 1>(texture_size.m_size, texture_size.m_size, &expected_value, result_data);

	/* Release the buffer */
	if (result_data != NULL)
	{
		delete[] result_data;

		result_data = NULL;
	}

	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);

	return result;
}